

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::TypeParameterizedTestSuiteRegistry::CheckForInstantiations
          (TypeParameterizedTestSuiteRegistry *this)

{
  int line;
  bool bVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *test_name;
  char *file;
  anon_class_112_2_99c2db9c_for_factory_ local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  string full_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string message;
  _Self local_40;
  reference local_38;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
  *testcase;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>_>
  *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ignored;
  TypeParameterizedTestSuiteRegistry *this_local;
  
  this_00 = GetIgnoredParameterizedTestSuites_abi_cxx11_();
  __end2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>_>
           ::begin(&this->suites_);
  testcase = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>_>
                ::end(&this->suites_);
  while (bVar1 = std::operator==(&__end2,(_Self *)&testcase), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_38 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>
               ::operator*(&__end2);
    if (((local_38->second).instantiated & 1U) == 0) {
      local_40._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(this_00,&local_38->first);
      message.field_2._8_8_ =
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_00);
      bVar1 = std::operator==(&local_40,(_Self *)((long)&message.field_2 + 8));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::operator+(&local_c8,"Type parameterized test suite ",&local_38->first);
        std::operator+(&local_a8,&local_c8,
                       " is defined via REGISTER_TYPED_TEST_SUITE_P, but never instantiated via INSTANTIATE_TYPED_TEST_SUITE_P. None of the test cases will run.\n\nIdeally, TYPED_TEST_P definitions should only ever be included as part of binaries that intend to use them. (As opposed to, for example, being placed in a library that may be linked in to get other utilities.)\n\nTo suppress this error for this test suite, insert the following line (in a non-header) in the namespace it is defined in:\n\nGTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST("
                      );
        std::operator+(&local_88,&local_a8,&local_38->first);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,&local_88,");");
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::operator+(&local_118,"UninstantiatedTypeParameterizedTestSuite<",&local_38->first);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                       ,&local_118,">");
        std::__cxx11::string::~string((string *)&local_118);
        test_name = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_f8);
        file = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_38->second);
        line = (local_38->second).code_location.line;
        std::__cxx11::string::string
                  ((string *)&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
        ::pair(&local_188.testcase,local_38);
        RegisterTest<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Przemyslawmd[P]Fifteen_build_O0__deps_googletest_src_googletest_src_gtest_cc:592:45)>
                  ("GoogleTestVerification",test_name,(char *)0x0,(char *)0x0,file,line,&local_188);
        CheckForInstantiations()::$_0::~__0((__0 *)&local_188);
        std::__cxx11::string::~string((string *)local_f8);
        std::__cxx11::string::~string((string *)local_68);
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void TypeParameterizedTestSuiteRegistry::CheckForInstantiations() {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  for (const auto& testcase : suites_) {
    if (testcase.second.instantiated) continue;
    if (ignored.find(testcase.first) != ignored.end()) continue;

    std::string message =
        "Type parameterized test suite " + testcase.first +
        " is defined via REGISTER_TYPED_TEST_SUITE_P, but never instantiated "
        "via INSTANTIATE_TYPED_TEST_SUITE_P. None of the test cases will run."
        "\n\n"
        "Ideally, TYPED_TEST_P definitions should only ever be included as "
        "part of binaries that intend to use them. (As opposed to, for "
        "example, being placed in a library that may be linked in to get other "
        "utilities.)"
        "\n\n"
        "To suppress this error for this test suite, insert the following line "
        "(in a non-header) in the namespace it is defined in:"
        "\n\n"
        "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" +
        testcase.first + ");";

    std::string full_name =
        "UninstantiatedTypeParameterizedTestSuite<" + testcase.first + ">";
    RegisterTest(  //
        "GoogleTestVerification", full_name.c_str(),
        nullptr,  // No type parameter.
        nullptr,  // No value parameter.
        testcase.second.code_location.file.c_str(),
        testcase.second.code_location.line, [message, testcase] {
          return new FailureTest(testcase.second.code_location, message,
                                 kErrorOnUninstantiatedTypeParameterizedTest);
        });
  }
}